

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void insertElement(Hash *pH,_ht *pEntry,HashElem *pNew)

{
  HashElem *local_28;
  HashElem *pHead;
  HashElem *pNew_local;
  _ht *pEntry_local;
  Hash *pH_local;
  
  if (pEntry == (_ht *)0x0) {
    pHead = (HashElem *)0x0;
  }
  else {
    if (pEntry->count == 0) {
      local_28 = (HashElem *)0x0;
    }
    else {
      local_28 = pEntry->chain;
    }
    pHead = local_28;
    pEntry->count = pEntry->count + 1;
    pEntry->chain = pNew;
  }
  if (pHead == (HashElem *)0x0) {
    pNew->next = pH->first;
    if (pH->first != (HashElem *)0x0) {
      pH->first->prev = pNew;
    }
    pNew->prev = (HashElem *)0x0;
    pH->first = pNew;
  }
  else {
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if (pHead->prev == (HashElem *)0x0) {
      pH->first = pNew;
    }
    else {
      pHead->prev->next = pNew;
    }
    pHead->prev = pNew;
  }
  return;
}

Assistant:

static void insertElement(
  Hash *pH,              /* The complete hash table */
  struct _ht *pEntry,    /* The entry into which pNew is inserted */
  HashElem *pNew         /* The element to be inserted */
){
  HashElem *pHead;       /* First element already in pEntry */
  if( pEntry ){
    pHead = pEntry->count ? pEntry->chain : 0;
    pEntry->count++;
    pEntry->chain = pNew;
  }else{
    pHead = 0;
  }
  if( pHead ){
    pNew->next = pHead;
    pNew->prev = pHead->prev;
    if( pHead->prev ){ pHead->prev->next = pNew; }
    else             { pH->first = pNew; }
    pHead->prev = pNew;
  }else{
    pNew->next = pH->first;
    if( pH->first ){ pH->first->prev = pNew; }
    pNew->prev = 0;
    pH->first = pNew;
  }
}